

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData256 * cfd::core::HashUtil::Sha256(ByteData256 *__return_storage_ptr__,Script *script)

{
  ByteData local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  Script *local_18;
  Script *script_local;
  
  local_18 = script;
  script_local = (Script *)__return_storage_ptr__;
  Script::GetData(&local_48,script);
  ByteData::GetBytes(&local_30,&local_48);
  Sha256(__return_storage_ptr__,&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  ByteData::~ByteData(&local_48);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 HashUtil::Sha256(const Script &script) {
  return Sha256(script.GetData().GetBytes());
}